

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O0

void __thiscall bdQueryManager::addPeer(bdQueryManager *this,bdId *id,uint32_t peerflags)

{
  bool bVar1;
  reference ppbVar2;
  _Self local_38;
  _List_node_base *local_30;
  _List_iterator<bdQuery_*> local_28;
  iterator it;
  uint32_t peerflags_local;
  bdId *id_local;
  bdQueryManager *this_local;
  
  it._M_node._4_4_ = peerflags;
  std::_List_iterator<bdQuery_*>::_List_iterator(&local_28);
  local_30 = (_List_node_base *)
             std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::begin(&this->mLocalQueries);
  local_28._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::end(&this->mLocalQueries);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    ppbVar2 = std::_List_iterator<bdQuery_*>::operator*(&local_28);
    bdQuery::addPeer(*ppbVar2,id,it._M_node._4_4_);
    std::_List_iterator<bdQuery_*>::operator++(&local_28,0);
  }
  return;
}

Assistant:

void bdQueryManager::addPeer(const bdId *id, uint32_t peerflags) {

#ifdef DEBUG_NODE_ACTIONS 
	fprintf(stderr, "bdQueryManager::addPeer(");
	mFns->bdPrintId(std::cerr, id);
	fprintf(stderr, ")\n");
#endif
	/* iterate through queries */
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++)
		(*it)->addPeer(id, peerflags);
}